

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode ssl_connect_init_proxy(connectdata *conn,int sockindex)

{
  ssl_backend_data *__s;
  ssl_backend_data *psVar1;
  ssl_connect_state sVar2;
  Curl_ssl *pCVar3;
  CURLcode CVar4;
  ssl_connect_data *psVar5;
  
  pCVar3 = Curl_ssl;
  CVar4 = CURLE_OK;
  if ((conn->ssl[sockindex].state == ssl_connection_complete) &&
     (CVar4 = CURLE_OK, (conn->proxy_ssl[sockindex].field_0x10 & 1) == 0)) {
    CVar4 = CURLE_NOT_BUILT_IN;
    if ((Curl_ssl->supports & 0x10) != 0) {
      psVar5 = conn->ssl + sockindex;
      __s = conn->proxy_ssl[sockindex].backend;
      *(undefined8 *)&conn->proxy_ssl[sockindex].field_0x10 =
           *(undefined8 *)&conn->ssl[sockindex].field_0x10;
      sVar2 = psVar5->connecting_state;
      psVar1 = conn->ssl[sockindex].backend;
      conn->proxy_ssl[sockindex].state = psVar5->state;
      conn->proxy_ssl[sockindex].connecting_state = sVar2;
      conn->proxy_ssl[sockindex].backend = psVar1;
      psVar5->state = ssl_connection_none;
      psVar5->connecting_state = ssl_connect_1;
      conn->ssl[sockindex].backend = (ssl_backend_data *)0x0;
      *(undefined8 *)&conn->ssl[sockindex].field_0x10 = 0;
      CVar4 = CURLE_OK;
      memset(__s,0,pCVar3->sizeof_ssl_backend_data);
      conn->ssl[sockindex].backend = __s;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode
ssl_connect_init_proxy(struct connectdata *conn, int sockindex)
{
  DEBUGASSERT(conn->bits.proxy_ssl_connected[sockindex]);
  if(ssl_connection_complete == conn->ssl[sockindex].state &&
     !conn->proxy_ssl[sockindex].use) {
    struct ssl_backend_data *pbdata;

    if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
      return CURLE_NOT_BUILT_IN;

    /* The pointers to the ssl backend data, which is opaque here, are swapped
       rather than move the contents. */
    pbdata = conn->proxy_ssl[sockindex].backend;
    conn->proxy_ssl[sockindex] = conn->ssl[sockindex];

    memset(&conn->ssl[sockindex], 0, sizeof(conn->ssl[sockindex]));
    memset(pbdata, 0, Curl_ssl->sizeof_ssl_backend_data);

    conn->ssl[sockindex].backend = pbdata;
  }
  return CURLE_OK;
}